

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapBlockMap32 *this,void *dirtyPage,HeapBlockType blockType,L2MapChunk *chunk,uint id2,
          bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  byte bVar1;
  undefined4 *puVar2;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  BVStatic<2048UL> *heapBlockMarkBits;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  if (chunk == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2c8,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar5) goto LAB_002176f8;
    *puVar2 = 0;
  }
  heapBlockMarkBits =
       BVStatic<65536ul>::GetRange<2048ul>
                 ((BVStatic<65536ul> *)chunk,(uint)((ulong)dirtyPage >> 4) & 0xf800);
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 0x1f) break;
      uVar4 = uVar6 + 1;
    } while (heapBlockMarkBits->data[uVar6 + 1].word == 0);
    if (0x1e < uVar6) {
      return false;
    }
  }
  if (chunk->map[id2]->heapBlockType != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2d2,"(chunk->map[id2]->GetHeapBlockType() == blockType)",
                       "chunk->map[id2]->GetHeapBlockType() == blockType");
    if (!bVar5) goto LAB_002176f8;
    *puVar2 = 0;
  }
  block = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)chunk->map[id2];
  bVar1 = chunk->blockInfo[id2].bucketIndex;
  if (0x1c < bVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x2ef,
                       "(IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity)))"
                       ,
                       "IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity))"
                      );
    if (!bVar5) {
LAB_002176f8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  bVar5 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
          ::RescanObjectsOnPage
                    (block,(char *)dirtyPage,(char *)((ulong)dirtyPage & 0xffffffffffff8000),
                     heapBlockMarkBits,(uint)bVar1 * 0x100 + 0x400,(uint)bVar1,
                     anyObjectsMarkedOnPage,recycler);
  if (!bVar5) {
    HeapBlock::SetNeedOOMRescan(chunk->map[id2],recycler);
  }
  return bVar5;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlock(void * dirtyPage, HeapBlock::HeapBlockType blockType, L2MapChunk* chunk, uint id2, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    Assert(chunk != nullptr);
    char* heapBlockPageAddress = TBlockType::GetBlockStartAddress((char*) dirtyPage);

    typedef typename TBlockType::HeapBlockAttributes TBlockAttributes;

    // We need to check the entire mark bit vector here. It's not sufficient to just check the page's
    // mark bit vector because the object that's dirty on the page could have started on an earlier page
    auto markBits = chunk->GetMarkBitVectorForPages<TBlockAttributes::BitVectorCount>(heapBlockPageAddress);
    if (!markBits->IsAllClear())
    {
        Assert(chunk->map[id2]->GetHeapBlockType() == blockType);

        // Small finalizable heap blocks require the HeapBlock * (to look up object attributes).
        // For others, this is null
        TBlockType* block = GetHeapBlockForRescan<TBlockType>(chunk, id2);
        uint bucketIndex = chunk->blockInfo[id2].bucketIndex;
        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(block,
            (char *)dirtyPage, heapBlockPageAddress, markBits, HeapInfo::GetObjectSizeForBucketIndex<TBlockAttributes>(bucketIndex), bucketIndex, anyObjectsMarkedOnPage, recycler))
        {
            // Failed due to OOM
            ((TBlockType*) chunk->map[id2])->SetNeedOOMRescan(recycler);
            return false;
        }

        return true;
    }

    // Didn't actually rescan the block.
    return false;
}